

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

void libcellml::makeEquivalence(IndexStack *stack1,IndexStack *stack2,ModelPtr *model)

{
  undefined1 local_40 [8];
  VariablePtr v2;
  VariablePtr v1;
  ModelPtr *model_local;
  IndexStack *stack2_local;
  IndexStack *stack1_local;
  
  getVariableLocatedAt
            ((libcellml *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             stack1,model);
  getVariableLocatedAt((libcellml *)local_40,stack2,model);
  Variable::addEquivalence
            ((VariablePtr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (VariablePtr *)local_40);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_40);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void makeEquivalence(const IndexStack &stack1, const IndexStack &stack2, const ModelPtr &model)
{
    auto v1 = getVariableLocatedAt(stack1, model);
    auto v2 = getVariableLocatedAt(stack2, model);
    Variable::addEquivalence(v1, v2);
}